

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::Fapply
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  bool bVar1;
  Geometry *this_00;
  FabArray<amrex::FArrayBox> *in_RDI;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *osm;
  Array4<const_double> *bzfab;
  Array4<const_double> *byfab;
  Array4<const_double> *bxfab;
  Array4<const_double> *afab;
  Array4<double> *yfab;
  Array4<const_double> *xfab;
  Box *bx;
  MFIter mfi;
  int ncomp;
  Real bscalar;
  Real ascalar;
  GpuArray<double,_3U> dxinv;
  MultiFab *bzcoef;
  MultiFab *bycoef;
  MultiFab *bxcoef;
  MultiFab *acoef;
  Real dhz;
  Real dhy;
  Real dhx;
  Real dhz_1;
  Real dhy_1;
  Real dhx_1;
  size_type in_stack_fffffffffffff518;
  MFIter *in_stack_fffffffffffff520;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  undefined4 in_stack_fffffffffffff544;
  undefined1 do_tiling_;
  int iVar2;
  FabArrayBase *in_stack_fffffffffffff548;
  undefined4 in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  int in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  int local_a78;
  int local_a74;
  int local_a70;
  int local_a6c;
  MFIter local_a28;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_9a0;
  long local_998 [8];
  long *local_958;
  long local_950 [8];
  long *local_910;
  long local_908 [8];
  long *local_8c8;
  long local_8c0 [8];
  long *local_880;
  long local_878 [8];
  long *local_838;
  int local_82c [7];
  int *local_810;
  MFIter local_808;
  int local_7a4;
  double local_7a0;
  double local_798;
  GpuArray<double,_3U> local_790;
  const_reference local_778;
  const_reference local_770;
  const_reference local_768;
  MultiFab *local_760;
  undefined8 local_738;
  int local_730;
  int *local_728;
  int local_71c;
  int iStack_718;
  int local_714;
  undefined8 local_710;
  int local_708;
  int *local_700;
  int local_6f4;
  int iStack_6f0;
  int local_6ec;
  undefined8 local_6e8;
  int local_6e0;
  int *local_6d8;
  int local_6cc;
  int iStack_6c8;
  int local_6c4;
  undefined8 local_6c0;
  int local_6b8;
  int *local_6b0;
  int local_6a4;
  int iStack_6a0;
  int local_69c;
  double local_698;
  double local_690;
  double local_688;
  double local_680;
  double local_678;
  GpuArray<double,_3U> *local_670;
  MFIter *local_668;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_660;
  long *local_658;
  long *local_650;
  long *local_648;
  long *local_640;
  long *local_638;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  int local_620;
  int local_61c;
  int local_618;
  int local_614;
  long *local_610;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  long *local_5f8;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_5e0;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  long *local_5c8;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  long *local_5b0;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_598;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  long *local_580;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  long *local_568;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  long *local_550;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  long *local_538;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  long *local_520;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  long *local_508;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  long *local_4f0;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  long *local_4d8;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  long *local_4c0;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  long *local_4a8;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  long *local_490;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  long *local_478;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  long *local_460;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  long *local_448;
  int local_440;
  int local_43c;
  int local_438;
  int local_434;
  long *local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408;
  GpuArray<double,_3U> *local_400;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_3f8;
  long *local_3f0;
  long *local_3e8;
  long *local_3e0;
  long *local_3d8;
  long *local_3d0;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  long *local_3a8;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  long *local_390;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_378;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  long *local_360;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  long *local_348;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_330;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  long *local_318;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  long *local_300;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  long *local_2e8;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  long *local_2d0;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  long *local_2b8;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  long *local_2a0;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  long *local_288;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  long *local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  long *local_258;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  long *local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_228;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  long *local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long *local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  MFIter *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  undefined4 local_1ac;
  int *local_1a8;
  undefined4 local_19c;
  int *local_198;
  undefined4 local_18c;
  int *local_188;
  undefined4 local_17c;
  int *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  GpuArray<double,_3U> *local_f8;
  undefined4 local_ec;
  GpuArray<double,_3U> *local_e8;
  undefined4 local_dc;
  GpuArray<double,_3U> *local_d8;
  undefined4 local_cc;
  GpuArray<double,_3U> *local_c8;
  undefined4 local_bc;
  GpuArray<double,_3U> *local_b8;
  undefined4 local_ac;
  GpuArray<double,_3U> *local_a8;
  undefined4 local_9c;
  GpuArray<double,_3U> *local_98;
  undefined4 local_8c;
  GpuArray<double,_3U> *local_88;
  undefined4 local_7c;
  GpuArray<double,_3U> *local_78;
  undefined4 local_6c;
  GpuArray<double,_3U> *local_68;
  undefined4 local_5c;
  GpuArray<double,_3U> *local_58;
  undefined4 local_4c;
  GpuArray<double,_3U> *local_48;
  int local_3c;
  int local_38;
  int local_34;
  long *local_30;
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffff544 >> 0x18);
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  local_760 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  local_768 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff520,
                         in_stack_fffffffffffff518);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  local_770 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff520,
                         in_stack_fffffffffffff518);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  local_778 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffff520,
                         in_stack_fffffffffffff518);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  CoordSys::InvCellSizeArray(&local_790,&this_00->super_CoordSys);
  local_798 = *(double *)((long)&in_RDI[2].super_FabArrayBase.boxarray.m_bat.m_op + 0x1c);
  local_7a0 = *(double *)((long)&in_RDI[2].super_FabArrayBase.boxarray.m_bat.m_op + 0x24);
  local_7a4 = (*(in_RDI->super_FabArrayBase)._vptr_FabArrayBase[5])();
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                 in_stack_fffffffffffff548,(bool)do_tiling_);
  while (bVar1 = MFIter::isValid(&local_808), bVar1) {
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580));
    local_810 = local_82c;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffff520);
    local_838 = local_878;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffff520);
    local_880 = local_8c0;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffff520);
    local_8c8 = local_908;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffff520);
    local_910 = local_950;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffff520);
    local_958 = local_998;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(in_RDI,in_stack_fffffffffffff520);
    local_9a0 = &local_a28.tile_array;
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                       0x155599f);
    if (bVar1) {
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_fffffffffffff520,in_stack_fffffffffffff518);
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x15559d9);
      in_stack_fffffffffffff520 = &local_a28;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_RDI,in_stack_fffffffffffff520);
      local_700 = local_810;
      local_138 = local_810;
      local_13c = 0;
      local_6f4 = *local_810;
      local_148 = local_810;
      local_14c = 1;
      iStack_6f0 = local_810[1];
      local_710 = *(undefined8 *)local_810;
      local_158 = local_810;
      local_15c = 2;
      local_708 = local_810[2];
      local_6b0 = local_810;
      local_198 = local_810 + 3;
      local_19c = 0;
      local_6a4 = *local_198;
      local_1a8 = local_810 + 3;
      local_1ac = 1;
      iStack_6a0 = local_810[4];
      local_6c0 = *(undefined8 *)local_198;
      local_1b8 = local_810 + 3;
      local_1bc = 2;
      local_6b8 = local_810[5];
      for (local_a6c = 0; local_a70 = local_708,
          local_a28.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff520
          , local_6ec = local_708, local_69c = local_6b8, local_a6c < local_7a4;
          local_a6c = local_a6c + 1) {
        for (; local_a74 = iStack_6f0, local_a70 <= local_6b8; local_a70 = local_a70 + 1) {
          for (; local_a78 = local_6f4, local_a74 <= iStack_6a0; local_a74 = local_a74 + 1) {
            for (; local_a78 <= local_6a4; local_a78 = local_a78 + 1) {
              local_624 = local_a78;
              local_628 = local_a74;
              local_62c = local_a70;
              local_630 = local_a6c;
              local_638 = local_880;
              local_640 = local_838;
              local_648 = local_8c8;
              local_650 = local_910;
              local_658 = local_958;
              local_660 = local_9a0;
              local_678 = local_798;
              local_680 = local_7a0;
              local_670 = &local_790;
              local_4c = 0;
              local_5c = 0;
              local_688 = local_7a0 * local_790.arr[0] * local_790.arr[0];
              local_6c = 1;
              local_7c = 1;
              local_690 = local_7a0 * local_790.arr[1] * local_790.arr[1];
              local_8c = 2;
              local_9c = 2;
              local_698 = local_7a0 * local_790.arr[2] * local_790.arr[2];
              local_1cc = local_a78;
              local_1d0 = local_a74;
              local_1d4 = local_a70;
              if (*(int *)((long)&((in_stack_fffffffffffff520->m_fa)._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                  )->_vptr_FabArrayBase +
                          ((long)(local_a78 - in_stack_fffffffffffff520->currentIndex) +
                           (long)(local_a74 - in_stack_fffffffffffff520->beginIndex) *
                           (long)in_stack_fffffffffffff520->fabArray +
                          (long)(local_a70 - in_stack_fffffffffffff520->endIndex) *
                          *(long *)(in_stack_fffffffffffff520->tile_size).vect) * 4) == 0) {
                local_430 = local_880;
                local_434 = local_a78;
                local_438 = local_a74;
                local_43c = local_a70;
                local_440 = local_a6c;
                *(undefined8 *)
                 (*local_880 +
                 ((long)(local_a78 - (int)local_880[4]) +
                  (long)(local_a74 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                  (long)(local_a70 - (int)local_880[5]) * local_880[2] +
                 (long)local_a6c * local_880[3]) * 8) = 0;
              }
              else {
                local_18 = local_8c8;
                local_1c = local_a78;
                local_20 = local_a74;
                local_24 = local_a70;
                local_460 = local_838;
                local_464 = local_a78;
                local_468 = local_a74;
                local_46c = local_a70;
                local_470 = local_a6c;
                local_47c = local_a78 + 1;
                local_478 = local_910;
                local_480 = local_a74;
                local_484 = local_a70;
                local_488 = local_a6c;
                local_494 = local_a78 + 1;
                local_490 = local_838;
                local_498 = local_a74;
                local_49c = local_a70;
                local_4a0 = local_a6c;
                local_4a8 = local_838;
                local_4ac = local_a78;
                local_4b0 = local_a74;
                local_4b4 = local_a70;
                local_4b8 = local_a6c;
                local_4c0 = local_910;
                local_4c4 = local_a78;
                local_4c8 = local_a74;
                local_4cc = local_a70;
                local_4d0 = local_a6c;
                local_4d8 = local_838;
                local_4dc = local_a78;
                local_4e0 = local_a74;
                local_4e4 = local_a70;
                local_4e8 = local_a6c;
                local_4f4 = local_a78 + -1;
                local_4f0 = local_838;
                local_4f8 = local_a74;
                local_4fc = local_a70;
                local_500 = local_a6c;
                local_510 = local_a74 + 1;
                local_508 = local_958;
                local_50c = local_a78;
                local_514 = local_a70;
                local_518 = local_a6c;
                local_528 = local_a74 + 1;
                local_520 = local_838;
                local_524 = local_a78;
                local_52c = local_a70;
                local_530 = local_a6c;
                local_538 = local_838;
                local_53c = local_a78;
                local_540 = local_a74;
                local_544 = local_a70;
                local_548 = local_a6c;
                local_550 = local_958;
                local_554 = local_a78;
                local_558 = local_a74;
                local_55c = local_a70;
                local_560 = local_a6c;
                local_568 = local_838;
                local_56c = local_a78;
                local_570 = local_a74;
                local_574 = local_a70;
                local_578 = local_a6c;
                local_588 = local_a74 + -1;
                local_580 = local_838;
                local_584 = local_a78;
                local_58c = local_a70;
                local_590 = local_a6c;
                local_5a4 = local_a70 + 1;
                local_598 = local_9a0;
                local_59c = local_a78;
                local_5a0 = local_a74;
                local_5a8 = local_a6c;
                local_5bc = local_a70 + 1;
                local_5b0 = local_838;
                local_5b4 = local_a78;
                local_5b8 = local_a74;
                local_5c0 = local_a6c;
                local_5c8 = local_838;
                local_5cc = local_a78;
                local_5d0 = local_a74;
                local_5d4 = local_a70;
                local_5d8 = local_a6c;
                local_5e0 = local_9a0;
                local_5e4 = local_a78;
                local_5e8 = local_a74;
                local_5ec = local_a70;
                local_5f0 = local_a6c;
                local_5f8 = local_838;
                local_5fc = local_a78;
                local_600 = local_a74;
                local_604 = local_a70;
                local_608 = local_a6c;
                local_61c = local_a70 + -1;
                local_610 = local_838;
                local_614 = local_a78;
                local_618 = local_a74;
                local_620 = local_a6c;
                local_448 = local_880;
                local_44c = local_a78;
                local_450 = local_a74;
                local_454 = local_a70;
                local_458 = local_a6c;
                *(double *)
                 (*local_880 +
                 ((long)(local_a78 - (int)local_880[4]) +
                  (long)(local_a74 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                  (long)(local_a70 - (int)local_880[5]) * local_880[2] +
                 (long)local_a6c * local_880[3]) * 8) =
                     -local_698 *
                     ((double)(&((*local_9a0)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                ).super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                _M_impl.super__Vector_impl_data._M_start)
                              [(long)(local_a78 - (int)local_9a0[4]) +
                               (long)(local_a74 - *(int *)((long)local_9a0 + 0x24)) *
                               (long)local_9a0[1] +
                               (long)(local_5a4 - (int)local_9a0[5]) * (long)local_9a0[2] +
                               (long)local_a6c * (long)local_9a0[3]] *
                      (*(double *)
                        (*local_838 +
                        ((long)(local_a78 - (int)local_838[4]) +
                         (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_5bc - (int)local_838[5]) * local_838[2] +
                        (long)local_a6c * local_838[3]) * 8) -
                      *(double *)
                       (*local_838 +
                       ((long)(local_a78 - (int)local_838[4]) +
                        (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                       (long)local_a6c * local_838[3]) * 8)) +
                     -((double)(&((*local_9a0)->
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start)
                               [(long)(local_a78 - (int)local_9a0[4]) +
                                (long)(local_a74 - *(int *)((long)local_9a0 + 0x24)) *
                                (long)local_9a0[1] +
                                (long)(local_a70 - (int)local_9a0[5]) * (long)local_9a0[2] +
                                (long)local_a6c * (long)local_9a0[3]] *
                      (*(double *)
                        (*local_838 +
                        ((long)(local_a78 - (int)local_838[4]) +
                         (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                        (long)local_a6c * local_838[3]) * 8) -
                      *(double *)
                       (*local_838 +
                       ((long)(local_a78 - (int)local_838[4]) +
                        (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_61c - (int)local_838[5]) * local_838[2] +
                       (long)local_a6c * local_838[3]) * 8)))) +
                     -local_690 *
                     (*(double *)
                       (*local_958 +
                       ((long)(local_a78 - (int)local_958[4]) +
                        (long)(local_510 - *(int *)((long)local_958 + 0x24)) * local_958[1] +
                        (long)(local_a70 - (int)local_958[5]) * local_958[2] +
                       (long)local_a6c * local_958[3]) * 8) *
                      (*(double *)
                        (*local_838 +
                        ((long)(local_a78 - (int)local_838[4]) +
                         (long)(local_528 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                        (long)local_a6c * local_838[3]) * 8) -
                      *(double *)
                       (*local_838 +
                       ((long)(local_a78 - (int)local_838[4]) +
                        (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                       (long)local_a6c * local_838[3]) * 8)) +
                     -(*(double *)
                        (*local_958 +
                        ((long)(local_a78 - (int)local_958[4]) +
                         (long)(local_a74 - *(int *)((long)local_958 + 0x24)) * local_958[1] +
                         (long)(local_a70 - (int)local_958[5]) * local_958[2] +
                        (long)local_a6c * local_958[3]) * 8) *
                      (*(double *)
                        (*local_838 +
                        ((long)(local_a78 - (int)local_838[4]) +
                         (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                        (long)local_a6c * local_838[3]) * 8) -
                      *(double *)
                       (*local_838 +
                       ((long)(local_a78 - (int)local_838[4]) +
                        (long)(local_588 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                       (long)local_a6c * local_838[3]) * 8)))) +
                     local_798 *
                     *(double *)
                      (*local_8c8 +
                      ((long)(local_a78 - (int)local_8c8[4]) +
                       (long)(local_a74 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                      (long)(local_a70 - (int)local_8c8[5]) * local_8c8[2]) * 8) *
                     *(double *)
                      (*local_838 +
                      ((long)(local_a78 - (int)local_838[4]) +
                       (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                       (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                      (long)local_a6c * local_838[3]) * 8) +
                     -(local_688 *
                      (*(double *)
                        (*local_910 +
                        ((long)(local_47c - (int)local_910[4]) +
                         (long)(local_a74 - *(int *)((long)local_910 + 0x24)) * local_910[1] +
                         (long)(local_a70 - (int)local_910[5]) * local_910[2] +
                        (long)local_a6c * local_910[3]) * 8) *
                       (*(double *)
                         (*local_838 +
                         ((long)(local_494 - (int)local_838[4]) +
                          (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                          (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                         (long)local_a6c * local_838[3]) * 8) -
                       *(double *)
                        (*local_838 +
                        ((long)(local_a78 - (int)local_838[4]) +
                         (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                        (long)local_a6c * local_838[3]) * 8)) +
                      -(*(double *)
                         (*local_910 +
                         ((long)(local_a78 - (int)local_910[4]) +
                          (long)(local_a74 - *(int *)((long)local_910 + 0x24)) * local_910[1] +
                          (long)(local_a70 - (int)local_910[5]) * local_910[2] +
                         (long)local_a6c * local_910[3]) * 8) *
                       (*(double *)
                         (*local_838 +
                         ((long)(local_a78 - (int)local_838[4]) +
                          (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                          (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                         (long)local_a6c * local_838[3]) * 8) -
                       *(double *)
                        (*local_838 +
                        ((long)(local_4f4 - (int)local_838[4]) +
                         (long)(local_a74 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_a70 - (int)local_838[5]) * local_838[2] +
                        (long)local_a6c * local_838[3]) * 8)))));
              }
              local_668 = in_stack_fffffffffffff520;
              local_1c8 = in_stack_fffffffffffff520;
              local_98 = local_670;
              local_88 = local_670;
              local_78 = local_670;
              local_68 = local_670;
              local_58 = local_670;
              local_48 = local_670;
            }
          }
        }
      }
    }
    else {
      local_728 = local_810;
      local_108 = local_810;
      local_10c = 0;
      local_71c = *local_810;
      local_118 = local_810;
      local_11c = 1;
      iStack_718 = local_810[1];
      local_738 = *(undefined8 *)local_810;
      local_128 = local_810;
      local_12c = 2;
      in_stack_fffffffffffff580 = local_810[2];
      local_6d8 = local_810;
      local_168 = local_810 + 3;
      local_16c = 0;
      local_6cc = *local_168;
      local_178 = local_810 + 3;
      local_17c = 1;
      iStack_6c8 = local_810[4];
      local_6e8 = *(undefined8 *)local_168;
      local_188 = local_810 + 3;
      local_18c = 2;
      local_6e0 = local_810[5];
      for (iVar2 = 0; local_ac0 = in_stack_fffffffffffff580, local_730 = in_stack_fffffffffffff580,
          local_714 = in_stack_fffffffffffff580, local_6c4 = local_6e0, iVar2 < local_7a4;
          iVar2 = iVar2 + 1) {
        for (; local_ac4 = iStack_718, local_ac0 <= local_6e0; local_ac0 = local_ac0 + 1) {
          for (; local_ac8 = local_71c, local_ac4 <= iStack_6c8; local_ac4 = local_ac4 + 1) {
            for (; local_ac8 <= local_6cc; local_ac8 = local_ac8 + 1) {
              local_3bc = local_ac8;
              local_3c0 = local_ac4;
              local_3c4 = local_ac0;
              local_3d0 = local_880;
              local_3d8 = local_838;
              local_3e0 = local_8c8;
              local_3e8 = local_910;
              local_3f0 = local_958;
              local_3f8 = local_9a0;
              local_408 = local_798;
              local_410 = local_7a0;
              local_400 = &local_790;
              local_ac = 0;
              local_bc = 0;
              local_418 = local_7a0 * local_790.arr[0] * local_790.arr[0];
              local_cc = 1;
              local_dc = 1;
              local_420 = local_7a0 * local_790.arr[1] * local_790.arr[1];
              local_ec = 2;
              local_fc = 2;
              local_428 = local_7a0 * local_790.arr[2] * local_790.arr[2];
              local_30 = local_8c8;
              local_34 = local_ac8;
              local_38 = local_ac4;
              local_3c = local_ac0;
              local_1f8 = local_838;
              local_1fc = local_ac8;
              local_200 = local_ac4;
              local_204 = local_ac0;
              local_210 = local_910;
              local_214 = local_ac8 + 1;
              local_218 = local_ac4;
              local_21c = local_ac0;
              local_228 = local_838;
              local_22c = local_ac8 + 1;
              local_230 = local_ac4;
              local_234 = local_ac0;
              local_240 = local_838;
              local_244 = local_ac8;
              local_248 = local_ac4;
              local_24c = local_ac0;
              local_258 = local_910;
              local_25c = local_ac8;
              local_260 = local_ac4;
              local_264 = local_ac0;
              local_270 = local_838;
              local_274 = local_ac8;
              local_278 = local_ac4;
              local_27c = local_ac0;
              local_288 = local_838;
              local_28c = local_ac8 + -1;
              local_290 = local_ac4;
              local_294 = local_ac0;
              local_2a0 = local_958;
              local_2a4 = local_ac8;
              local_2a8 = local_ac4 + 1;
              local_2ac = local_ac0;
              local_2b8 = local_838;
              local_2bc = local_ac8;
              local_2c0 = local_ac4 + 1;
              local_2c4 = local_ac0;
              local_2d0 = local_838;
              local_2d4 = local_ac8;
              local_2d8 = local_ac4;
              local_2dc = local_ac0;
              local_2e8 = local_958;
              local_2ec = local_ac8;
              local_2f0 = local_ac4;
              local_2f4 = local_ac0;
              local_300 = local_838;
              local_304 = local_ac8;
              local_308 = local_ac4;
              local_30c = local_ac0;
              local_318 = local_838;
              local_31c = local_ac8;
              local_320 = local_ac4 + -1;
              local_324 = local_ac0;
              local_330 = local_9a0;
              local_334 = local_ac8;
              local_338 = local_ac4;
              local_33c = local_ac0 + 1;
              local_348 = local_838;
              local_34c = local_ac8;
              local_350 = local_ac4;
              local_354 = local_ac0 + 1;
              local_360 = local_838;
              local_364 = local_ac8;
              local_368 = local_ac4;
              local_36c = local_ac0;
              local_378 = local_9a0;
              local_37c = local_ac8;
              local_380 = local_ac4;
              local_384 = local_ac0;
              local_390 = local_838;
              local_394 = local_ac8;
              local_398 = local_ac4;
              local_39c = local_ac0;
              local_3a8 = local_838;
              local_3ac = local_ac8;
              local_3b0 = local_ac4;
              local_3b4 = local_ac0 + -1;
              local_1e0 = local_880;
              local_1e4 = local_ac8;
              local_1e8 = local_ac4;
              local_1ec = local_ac0;
              *(double *)
               (*local_880 +
               ((long)(local_ac8 - (int)local_880[4]) +
                (long)(local_ac4 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                (long)(local_ac0 - (int)local_880[5]) * local_880[2] + (long)iVar2 * local_880[3]) *
               8) = -local_428 *
                    ((double)(&((*local_9a0)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>)
                               .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start)
                             [(long)(local_ac8 - (int)local_9a0[4]) +
                              (long)(local_ac4 - *(int *)((long)local_9a0 + 0x24)) *
                              (long)local_9a0[1] +
                              (long)(local_33c - (int)local_9a0[5]) * (long)local_9a0[2] +
                              (long)iVar2 * (long)local_9a0[3]] *
                     (*(double *)
                       (*local_838 +
                       ((long)(local_ac8 - (int)local_838[4]) +
                        (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_354 - (int)local_838[5]) * local_838[2] +
                       (long)iVar2 * local_838[3]) * 8) -
                     *(double *)
                      (*local_838 +
                      ((long)(local_ac8 - (int)local_838[4]) +
                       (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                       (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                      (long)iVar2 * local_838[3]) * 8)) +
                    -((double)(&((*local_9a0)->super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                ).super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                _M_impl.super__Vector_impl_data._M_start)
                              [(long)(local_ac8 - (int)local_9a0[4]) +
                               (long)(local_ac4 - *(int *)((long)local_9a0 + 0x24)) *
                               (long)local_9a0[1] +
                               (long)(local_ac0 - (int)local_9a0[5]) * (long)local_9a0[2] +
                               (long)iVar2 * (long)local_9a0[3]] *
                     (*(double *)
                       (*local_838 +
                       ((long)(local_ac8 - (int)local_838[4]) +
                        (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                       (long)iVar2 * local_838[3]) * 8) -
                     *(double *)
                      (*local_838 +
                      ((long)(local_ac8 - (int)local_838[4]) +
                       (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                       (long)(local_3b4 - (int)local_838[5]) * local_838[2] +
                      (long)iVar2 * local_838[3]) * 8)))) +
                    -local_420 *
                    (*(double *)
                      (*local_958 +
                      ((long)(local_ac8 - (int)local_958[4]) +
                       (long)(local_2a8 - *(int *)((long)local_958 + 0x24)) * local_958[1] +
                       (long)(local_ac0 - (int)local_958[5]) * local_958[2] +
                      (long)iVar2 * local_958[3]) * 8) *
                     (*(double *)
                       (*local_838 +
                       ((long)(local_ac8 - (int)local_838[4]) +
                        (long)(local_2c0 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                       (long)iVar2 * local_838[3]) * 8) -
                     *(double *)
                      (*local_838 +
                      ((long)(local_ac8 - (int)local_838[4]) +
                       (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                       (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                      (long)iVar2 * local_838[3]) * 8)) +
                    -(*(double *)
                       (*local_958 +
                       ((long)(local_ac8 - (int)local_958[4]) +
                        (long)(local_ac4 - *(int *)((long)local_958 + 0x24)) * local_958[1] +
                        (long)(local_ac0 - (int)local_958[5]) * local_958[2] +
                       (long)iVar2 * local_958[3]) * 8) *
                     (*(double *)
                       (*local_838 +
                       ((long)(local_ac8 - (int)local_838[4]) +
                        (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                       (long)iVar2 * local_838[3]) * 8) -
                     *(double *)
                      (*local_838 +
                      ((long)(local_ac8 - (int)local_838[4]) +
                       (long)(local_320 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                       (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                      (long)iVar2 * local_838[3]) * 8)))) +
                    local_798 *
                    *(double *)
                     (*local_8c8 +
                     ((long)(local_ac8 - (int)local_8c8[4]) +
                      (long)(local_ac4 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                     (long)(local_ac0 - (int)local_8c8[5]) * local_8c8[2]) * 8) *
                    *(double *)
                     (*local_838 +
                     ((long)(local_ac8 - (int)local_838[4]) +
                      (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                      (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                     (long)iVar2 * local_838[3]) * 8) +
                    -(local_418 *
                     (*(double *)
                       (*local_910 +
                       ((long)(local_214 - (int)local_910[4]) +
                        (long)(local_ac4 - *(int *)((long)local_910 + 0x24)) * local_910[1] +
                        (long)(local_ac0 - (int)local_910[5]) * local_910[2] +
                       (long)iVar2 * local_910[3]) * 8) *
                      (*(double *)
                        (*local_838 +
                        ((long)(local_22c - (int)local_838[4]) +
                         (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                        (long)iVar2 * local_838[3]) * 8) -
                      *(double *)
                       (*local_838 +
                       ((long)(local_ac8 - (int)local_838[4]) +
                        (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                       (long)iVar2 * local_838[3]) * 8)) +
                     -(*(double *)
                        (*local_910 +
                        ((long)(local_ac8 - (int)local_910[4]) +
                         (long)(local_ac4 - *(int *)((long)local_910 + 0x24)) * local_910[1] +
                         (long)(local_ac0 - (int)local_910[5]) * local_910[2] +
                        (long)iVar2 * local_910[3]) * 8) *
                      (*(double *)
                        (*local_838 +
                        ((long)(local_ac8 - (int)local_838[4]) +
                         (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                         (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                        (long)iVar2 * local_838[3]) * 8) -
                      *(double *)
                       (*local_838 +
                       ((long)(local_28c - (int)local_838[4]) +
                        (long)(local_ac4 - *(int *)((long)local_838 + 0x24)) * local_838[1] +
                        (long)(local_ac0 - (int)local_838[5]) * local_838[2] +
                       (long)iVar2 * local_838[3]) * 8)))));
              local_3c8 = iVar2;
              local_3b8 = iVar2;
              local_3a0 = iVar2;
              local_388 = iVar2;
              local_370 = iVar2;
              local_358 = iVar2;
              local_340 = iVar2;
              local_328 = iVar2;
              local_310 = iVar2;
              local_2f8 = iVar2;
              local_2e0 = iVar2;
              local_2c8 = iVar2;
              local_2b0 = iVar2;
              local_298 = iVar2;
              local_280 = iVar2;
              local_268 = iVar2;
              local_250 = iVar2;
              local_238 = iVar2;
              local_220 = iVar2;
              local_208 = iVar2;
              local_1f0 = iVar2;
              local_f8 = local_400;
              local_e8 = local_400;
              local_d8 = local_400;
              local_c8 = local_400;
              local_b8 = local_400;
              local_a8 = local_400;
            }
          }
        }
      }
    }
    MFIter::operator++(&local_808);
  }
  MFIter::~MFIter(in_stack_fffffffffffff520);
  return;
}

Assistant:

void
MLABecLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLABecLaplacian::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && out.isFusingCandidate()) {
        const auto& xma = in.const_arrays();
        const auto& yma = out.arrays();
        const auto& ama = acoef.arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx_os(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                   AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                   osmma[box_no], dxinv, ascalar, bscalar);
            });
        } else {
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
            });
        }
        Gpu::streamSynchronize();
    }